

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

Importstr * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::Importstr>(Allocator *this,Importstr *ast)

{
  Importstr *this_00;
  Importstr *local_20;
  
  this_00 = (Importstr *)operator_new(0x88);
  Importstr::Importstr(this_00,ast);
  local_20 = this_00;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (&this->allocated,(value_type *)&local_20);
  return this_00;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }